

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O0

BOOL __thiscall
Js::HeapArgumentsObject::GetItemAt
          (HeapArgumentsObject *this,uint32 index,Var *value,ScriptContext *requestContext)

{
  BOOL BVar1;
  DynamicObject *this_00;
  Var pvVar2;
  ScriptContext *requestContext_local;
  Var *value_local;
  uint32 index_local;
  HeapArgumentsObject *this_local;
  
  BVar1 = HasItemAt(this,index);
  if (BVar1 != 0) {
    this_00 = &Memory::WriteBarrierPtr<Js::ActivationObject>::operator->(&this->frameObject)->
               super_DynamicObject;
    pvVar2 = DynamicObject::GetSlot(this_00,index);
    *value = pvVar2;
  }
  this_local._4_4_ = (uint)(BVar1 != 0);
  return this_local._4_4_;
}

Assistant:

BOOL HeapArgumentsObject::GetItemAt(uint32 index, Var* value, ScriptContext* requestContext)
    {
        // If this arg index is bound to a named formal argument, get it from the local frame.
        // If not, report this fact to the caller, which will defer to the normal get-value-by-index means.
        if (HasItemAt(index))
        {
            *value = this->frameObject->GetSlot(index);
            return true;
        }

        return false;
    }